

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_pruneL.h
# Opt level: O1

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::pruneL
          (SparseLUImpl<double,_int> *this,int jcol,IndexVector *perm_r,int pivrow,int nseg,
          IndexVector *segrep,BlockIndexVector *repfnz,IndexVector *xprune,GlobalLU_t *glu)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  double *pdVar18;
  long lVar19;
  int iVar20;
  char *__function;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  bool bVar32;
  bool bVar33;
  
  if (-1 < jcol) {
    lVar5 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (jcol < lVar5) {
      if (0 < nseg) {
        piVar6 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        iVar2 = piVar6[jcol];
        piVar7 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar23 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
        piVar8 = (xprune->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        lVar9 = (xprune->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
        lVar10 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
        piVar11 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        uVar30 = 0;
        if ((long)uVar23 < 1) {
          uVar23 = uVar30;
        }
        piVar12 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data;
        iVar20 = 0;
        iVar21 = 0;
        do {
          if (uVar30 == uVar23) {
LAB_00150e79:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xad,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                         );
          }
          iVar3 = piVar7[uVar30];
          lVar29 = (long)iVar3;
          if ((lVar29 < 0) ||
             (*(long *)&(repfnz->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ).field_0x8 <= lVar29)) {
            __function = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<int, -1, 1>>, Level = 1]"
            ;
            goto LAB_00150e6f;
          }
          if (*(int *)(*(long *)&repfnz->
                                 super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      + lVar29 * 4) != -1) {
            if ((lVar5 <= lVar29) || (uVar24 = (ulong)(iVar3 + 1), lVar5 <= (long)uVar24))
            goto LAB_00150e5a;
            iVar4 = piVar6[lVar29];
            if ((iVar4 != piVar6[uVar24]) && (iVar4 != iVar2)) {
              if ((lVar9 <= lVar29) || (lVar10 <= (long)uVar24)) goto LAB_00150e5a;
              iVar31 = piVar12[uVar24];
              if (piVar8[lVar29] < iVar31) {
LAB_00150cb7:
                bVar32 = false;
              }
              else {
                if (lVar10 <= lVar29) goto LAB_00150e5a;
                iVar21 = piVar12[lVar29];
                iVar20 = iVar31 + -1;
                if (iVar31 <= iVar21) goto LAB_00150cb7;
                lVar27 = (long)iVar21;
                do {
                  if ((iVar21 < 0) ||
                     ((glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows <= lVar27)) goto LAB_00150e5a;
                  bVar32 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[lVar27] == pivrow;
                } while ((!bVar32) &&
                        (bVar33 = (long)iVar31 + -1 != lVar27, lVar27 = lVar27 + 1, bVar33));
              }
              if (bVar32) {
                if ((iVar4 < 0) ||
                   ((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows <= (long)iVar4)) goto LAB_00150e5a;
                if (iVar21 <= iVar20) {
                  iVar4 = piVar11[iVar4];
                  lVar27 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows;
                  piVar13 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                  piVar14 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data;
                  lVar15 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows;
                  lVar16 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                           .m_storage.m_rows;
                  piVar17 = (glu->xlusup).
                            super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                            m_data;
                  pdVar18 = (glu->lusup).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data;
                  lVar19 = (glu->lusup).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
                  do {
                    if ((iVar20 < 0) || (lVar25 = (long)iVar20, lVar27 <= lVar25))
                    goto LAB_00150e5a;
                    lVar28 = (long)piVar13[lVar25];
                    if ((lVar28 < 0) || (lVar15 <= lVar28)) goto LAB_00150e79;
                    if (piVar14[lVar28] == -1) {
LAB_00150e15:
                      iVar20 = iVar20 + -1;
                    }
                    else {
                      if ((iVar21 < 0) || (lVar28 = (long)iVar21, lVar27 <= lVar28))
                      goto LAB_00150e5a;
                      iVar31 = piVar13[lVar28];
                      lVar26 = (long)iVar31;
                      if ((lVar26 < 0) || (lVar15 <= lVar26)) goto LAB_00150e79;
                      if (piVar14[lVar26] == -1) {
                        piVar13[lVar28] = piVar13[lVar25];
                        piVar13[lVar25] = iVar31;
                        if (iVar3 == iVar4) {
                          if ((lVar16 <= lVar29) || (lVar10 <= lVar29)) goto LAB_00150e5a;
                          iVar31 = piVar17[lVar29];
                          iVar22 = (iVar21 - piVar12[lVar29]) + iVar31;
                          if ((iVar22 < 0) ||
                             (((lVar25 = (long)iVar22, lVar19 <= lVar25 ||
                               (iVar31 = (iVar20 - piVar12[lVar29]) + iVar31, iVar31 < 0)) ||
                              (lVar28 = (long)iVar31, lVar19 <= lVar28)))) {
                            __function = 
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                            ;
                            goto LAB_00150e6f;
                          }
                          dVar1 = pdVar18[lVar25];
                          pdVar18[lVar25] = pdVar18[lVar28];
                          pdVar18[lVar28] = dVar1;
                        }
                        iVar21 = iVar21 + 1;
                        goto LAB_00150e15;
                      }
                      iVar21 = iVar21 + 1;
                    }
                  } while (iVar21 <= iVar20);
                }
                piVar8[lVar29] = iVar21;
              }
            }
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != (uint)nseg);
      }
      return;
    }
  }
LAB_00150e5a:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
LAB_00150e6f:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,__function);
}

Assistant:

void SparseLUImpl<Scalar,Index>::pruneL(const Index jcol, const IndexVector& perm_r, const Index pivrow, const Index nseg, const IndexVector& segrep, BlockIndexVector repfnz, IndexVector& xprune, GlobalLU_t& glu)
{
  // For each supernode-rep irep in U(*,j]
  Index jsupno = glu.supno(jcol); 
  Index i,irep,irep1; 
  bool movnum, do_prune = false; 
  Index kmin = 0, kmax = 0, minloc, maxloc,krow; 
  for (i = 0; i < nseg; i++)
  {
    irep = segrep(i); 
    irep1 = irep + 1; 
    do_prune = false; 
    
    // Don't prune with a zero U-segment 
    if (repfnz(irep) == emptyIdxLU) continue; 
    
    // If a snode overlaps with the next panel, then the U-segment
    // is fragmented into two parts -- irep and irep1. We should let 
    // pruning occur at the rep-column in irep1s snode. 
    if (glu.supno(irep) == glu.supno(irep1) ) continue; // don't prune 
    
    // If it has not been pruned & it has a nonz in row L(pivrow,i)
    if (glu.supno(irep) != jsupno )
    {
      if ( xprune (irep) >= glu.xlsub(irep1) )
      {
        kmin = glu.xlsub(irep);
        kmax = glu.xlsub(irep1) - 1; 
        for (krow = kmin; krow <= kmax; krow++)
        {
          if (glu.lsub(krow) == pivrow) 
          {
            do_prune = true; 
            break; 
          }
        }
      }
      
      if (do_prune) 
      {
        // do a quicksort-type partition
        // movnum=true means that the num values have to be exchanged
        movnum = false; 
        if (irep == glu.xsup(glu.supno(irep)) ) // Snode of size 1 
          movnum = true; 
        
        while (kmin <= kmax)
        {
          if (perm_r(glu.lsub(kmax)) == emptyIdxLU)
            kmax--; 
          else if ( perm_r(glu.lsub(kmin)) != emptyIdxLU)
            kmin++;
          else 
          {
            // kmin below pivrow (not yet pivoted), and kmax
            // above pivrow: interchange the two suscripts
            std::swap(glu.lsub(kmin), glu.lsub(kmax)); 
            
            // If the supernode has only one column, then we 
            // only keep one set of subscripts. For any subscript
            // intercnahge performed, similar interchange must be 
            // done on the numerical values. 
            if (movnum) 
            {
              minloc = glu.xlusup(irep) + ( kmin - glu.xlsub(irep) ); 
              maxloc = glu.xlusup(irep) + ( kmax - glu.xlsub(irep) ); 
              std::swap(glu.lusup(minloc), glu.lusup(maxloc)); 
            }
            kmin++;
            kmax--;
          }
        } // end while 
        
        xprune(irep) = kmin;  //Pruning 
      } // end if do_prune 
    } // end pruning 
  } // End for each U-segment
}